

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void __thiscall Fl_Value_Output_Type::~Fl_Value_Output_Type(Fl_Value_Output_Type *this)

{
  Fl_Value_Output_Type *this_local;
  
  ~Fl_Value_Output_Type(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    Fl_Value_Output *myo = (Fl_Value_Output *)o;
    fl_font(myo->textfont(), myo->textsize());
    h = fl_height() + myo->textsize() - 6;
    w = o->w() - Fl::box_dw(o->box());
    int ww = (int)fl_width('m');
    w = ((w + ww - 1) / ww) * ww + Fl::box_dw(o->box());
    if (h < 15) h = 15;
    if (w < 15) w = 15;
  }